

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colStrBuf.c
# Opt level: O0

int Col_StringBufferAppendSequence(Col_Word strbuf,ColRopeIterator *begin,ColRopeIterator *end)

{
  int iVar1;
  uint uVar2;
  Col_Word rope_00;
  Col_Char2 *local_e0;
  Col_Char2 *local_d8;
  Col_Char2 *local_d0;
  Col_Char2 *local_c8;
  Col_Char2 *local_c0;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  undefined1 local_78 [4];
  int noLoss;
  Col_RopeIterator it;
  Col_Word rope;
  Col_StringFormat format;
  ColRopeIterator *end_local;
  ColRopeIterator *begin_local;
  Col_Word strbuf_local;
  
  iVar1 = Col_RopeIterCompare(begin,end);
  if (iVar1 < 0) {
    if (strbuf == 0) {
      local_80 = 0;
    }
    else {
      if ((strbuf & 0xf) == 0) {
        if ((*(byte *)strbuf & 2) == 0) {
          local_88 = 0xffffffff;
        }
        else {
          local_88 = *(byte *)strbuf & 0xfffffffe;
        }
        local_84 = local_88;
      }
      else {
        local_84 = immediateWordTypes[strbuf & 0x1f];
      }
      local_80 = local_84;
    }
    begin_local = (ColRopeIterator *)strbuf;
    if ((local_80 == 2) && ((*(ushort *)(strbuf + 2) & 0xc) == 0)) {
      begin_local = *(ColRopeIterator **)(strbuf + 0x10);
    }
    it[0].chunk.current._8_8_ = begin->rope;
    if ((it[0].chunk.current._8_8_ == 0) ||
       (end->index - begin->index <=
        ((long)(int)((uint)*(ushort *)((long)&begin_local->rope + 2) << 5) - 0x18U) /
        (ulong)((int)*(char *)((long)&begin_local->rope + 1) & 7) - begin_local->index)) {
      local_7c = 1;
      memcpy(local_78,begin,0x40);
      while (iVar1 = Col_RopeIterCompare((ColRopeIterator *)local_78,end), iVar1 < 0) {
        if ((it[0].length < it[0].index) || (it[0].chunk.first < it[0].length)) {
          local_9c = ColRopeIterUpdateTraversalInfo((ColRopeIterator *)local_78);
        }
        else {
          if (it[0].chunk.last == 0) {
            if ((int)it[0].chunk.accessProc == 1) {
              local_a4 = (uint)*(byte *)it[0].chunk.current._0_8_;
            }
            else {
              if ((int)it[0].chunk.accessProc == 2) {
                local_a8 = (uint)*(ushort *)it[0].chunk.current._0_8_;
              }
              else {
                if ((int)it[0].chunk.accessProc == 4) {
                  local_ac = *(uint *)it[0].chunk.current._0_8_;
                }
                else {
                  if ((int)it[0].chunk.accessProc == 0x11) {
                    local_b0 = Col_Utf8Get((Col_Char1 *)it[0].chunk.current._0_8_);
                  }
                  else {
                    if ((int)it[0].chunk.accessProc == 0x12) {
                      local_b4 = Col_Utf16Get((Col_Char2 *)it[0].chunk.current._0_8_);
                    }
                    else {
                      local_b4 = 0xffffffff;
                    }
                    local_b0 = local_b4;
                  }
                  local_ac = local_b0;
                }
                local_a8 = local_ac;
              }
              local_a4 = local_a8;
            }
            local_a0 = local_a4;
          }
          else {
            local_a0 = (*(code *)it[0].chunk.last)
                                 (CONCAT44(it[0].chunk.accessProc._4_4_,(int)it[0].chunk.accessProc)
                                  ,it[0].chunk.current.access.leaf);
          }
          local_9c = local_a0;
        }
        uVar2 = Col_StringBufferAppendChar((Col_Word)begin_local,local_9c);
        local_7c = uVar2 & local_7c;
        if ((it[0].length < it[0].index) || (it[0].chunk.first <= it[0].length)) {
          Col_RopeIterForward((ColRopeIterator *)local_78,1);
        }
        else {
          it[0].length = it[0].length + 1;
          if (it[0].chunk.last == 0) {
            if ((int)it[0].chunk.accessProc == 1) {
              local_c0 = (Col_Char2 *)(it[0].chunk.current.access.leaf + 1);
            }
            else {
              if ((int)it[0].chunk.accessProc == 2) {
                local_c8 = (Col_Char2 *)(it[0].chunk.current.access.leaf + 2);
              }
              else {
                if ((int)it[0].chunk.accessProc == 4) {
                  local_d0 = (Col_Char2 *)(it[0].chunk.current.access.leaf + 4);
                }
                else {
                  if ((int)it[0].chunk.accessProc == 0x11) {
                    local_d8 = (Col_Char2 *)Col_Utf8Next((Col_Char1 *)it[0].chunk.current._0_8_);
                  }
                  else {
                    if ((int)it[0].chunk.accessProc == 0x12) {
                      local_e0 = Col_Utf16Next((Col_Char2 *)it[0].chunk.current._0_8_);
                    }
                    else {
                      local_e0 = (Col_Char2 *)0x0;
                    }
                    local_d8 = local_e0;
                  }
                  local_d0 = local_d8;
                }
                local_c8 = local_d0;
              }
              local_c0 = local_c8;
            }
            it[0].chunk.current.access.leaf = local_c0;
          }
          else {
            it[0].chunk.current._0_8_ = it[0].chunk.current.access.leaf + 1;
          }
        }
      }
      strbuf_local._4_4_ = local_7c;
    }
    else {
      rope_00 = Col_Subrope(it[0].chunk.current._8_8_,begin->index,end->index - 1);
      strbuf_local._4_4_ = Col_StringBufferAppendRope((Col_Word)begin_local,rope_00);
    }
  }
  else {
    strbuf_local._4_4_ = 1;
  }
  return strbuf_local._4_4_;
}

Assistant:

int
Col_StringBufferAppendSequence(
    Col_Word strbuf,                /*!< String buffer to append character
                                         sequence to. */
    const Col_RopeIterator begin,   /*!< First character in sequence. */
    const Col_RopeIterator end)     /*!< First character past sequence end. */
{
    Col_StringFormat format;
    Col_Word rope;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_STRBUF,strbuf} */
    TYPECHECK_STRBUF(strbuf) return 0;

    if (Col_RopeIterCompare(begin, end) >= 0) {
        /*
         * Nothing to do.
         */

        return 1;
    }

    WORD_UNWRAP(strbuf);

    rope = Col_RopeIterRope(begin);
    format = (Col_StringFormat) WORD_STRBUF_FORMAT(strbuf);
    if (!rope || (Col_RopeIterIndex(end) - Col_RopeIterIndex(begin))
            <= STRBUF_MAX_LENGTH(WORD_STRBUF_SIZE(strbuf)
            * CELL_SIZE, format) - WORD_STRBUF_LENGTH(strbuf)) {
        /*
         * Sequence is in string mode or fits into buffer, append
         * character-wise.
         */

        Col_RopeIterator it;
        int noLoss = 1;
        for (Col_RopeIterSet(it, begin); Col_RopeIterCompare(it, end) < 0;
                Col_RopeIterNext(it)) {
            noLoss &= Col_StringBufferAppendChar(strbuf, Col_RopeIterAt(it));
        }
        return noLoss;
    }

    /*
     * Append subrope.
     */

    return Col_StringBufferAppendRope(strbuf, Col_Subrope(rope,
            Col_RopeIterIndex(begin), Col_RopeIterIndex(end)-1));
}